

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bucket_skew.cpp
# Opt level: O2

void compute_skew<4u>(vector<unsigned_int,_std::allocator<unsigned_int>_> *input,string *name)

{
  int *piVar1;
  double dVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  uint32_t uVar7;
  ulong uVar8;
  pointer puVar9;
  pointer pvVar10;
  ostream *poVar11;
  pointer pdVar12;
  int iVar13;
  size_t i_1;
  uint uVar14;
  size_t i_2;
  int iVar15;
  size_t i;
  ulong uVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar19 [64];
  undefined1 auVar20 [16];
  undefined1 in_XMM3 [16];
  allocator_type local_e9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_sizes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_usage;
  double local_b8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  real_dists;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_max;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bucket_min;
  undefined1 extraout_var [56];
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&bucket_map,0x8000000,(allocator_type *)&bucket_sizes);
  for (uVar16 = 0;
      uVar16 < (ulong)((long)bucket_map.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)bucket_map.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
    uVar7 = compute_bucket<4u>((uint32_t)uVar16);
    bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar16] = uVar7;
  }
  bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bucket_max.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bucket_max.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bucket_max.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar14 = *bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&bucket_min,(uint *)&bucket_usage);
  iVar13 = 1;
  uVar16 = 1;
  iVar15 = 0;
  while( true ) {
    uVar8 = (long)bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_start >> 2;
    if (uVar8 <= uVar16) break;
    uVar4 = bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar16];
    if (uVar4 != uVar14) {
      bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iVar15;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&bucket_max,(uint *)&bucket_usage);
      bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = (int)uVar16;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&bucket_min,(uint *)&bucket_usage);
      bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iVar13;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&bucket_sizes,(uint *)&bucket_usage);
      iVar13 = 0;
    }
    iVar13 = iVar13 + 1;
    uVar16 = uVar16 + 1;
    iVar15 = iVar15 + 1;
    uVar14 = uVar4;
  }
  if (iVar13 != 0) {
    bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = (int)uVar8 + -1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&bucket_max,(uint *)&bucket_usage);
    bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = iVar13;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&bucket_sizes,(uint *)&bucket_usage);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&bucket_usage,
             (long)bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&real_dists);
  for (uVar16 = 0;
      puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar16 < (ulong)((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2);
      uVar16 = uVar16 + 1) {
    uVar7 = compute_bucket<4u>(puVar9[uVar16]);
    piVar1 = (int *)(CONCAT44(bucket_usage.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)bucket_usage.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) + (ulong)uVar7 * 4);
    *piVar1 = *piVar1 + 1;
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&real_dists,
           (long)bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 2,&local_e9);
  puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar16 = 0;
      uVar16 < (ulong)((long)(input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)puVar9 >> 2);
      uVar16 = uVar16 + 1) {
    uVar7 = compute_bucket<4u>(puVar9[uVar16]);
    pdVar12 = real_dists.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    if (real_dists.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar7].
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish == pdVar12) {
      std::vector<double,_std::allocator<double>_>::resize
                (real_dists.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7,
                 (ulong)bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar7]);
      pdVar12 = real_dists.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar7].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
    }
    puVar9 = (input->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar12[puVar9[uVar16] -
            bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7]] =
         pdVar12[puVar9[uVar16] -
                 bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7]] + 1.0;
  }
  for (uVar16 = 0;
      uVar16 < (ulong)((long)bucket_sizes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)bucket_sizes.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
    if (*(int *)(CONCAT44(bucket_usage.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          (int)bucket_usage.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start) + uVar16 * 4) != 0) {
      auVar6 = vcvtusi2sd_avx512f(in_XMM3,bucket_sizes.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar16]);
      dVar18 = log2(1.0 / auVar6._0_8_);
      local_b8 = 0.0;
      pvVar10 = real_dists.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (uVar8 = 0;
          pdVar12 = pvVar10[uVar16].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
          uVar8 < (ulong)((long)pvVar10[uVar16].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar12 >> 3);
          uVar8 = uVar8 + 1) {
        dVar2 = pdVar12[uVar8];
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          auVar6 = vcvtusi2sd_avx512f(in_XMM3,*(undefined4 *)
                                               (CONCAT44(bucket_usage.
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  (int)bucket_usage.
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) +
                                               uVar16 * 4));
          auVar19._0_8_ = log2(dVar2 / auVar6._0_8_);
          auVar19._8_56_ = extraout_var;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_b8;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = real_dists.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar16].
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
          auVar6 = vfnmadd231sd_fma(auVar20,auVar19._0_16_,auVar3);
          local_b8 = auVar6._0_8_;
          pvVar10 = real_dists.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
      }
      uVar5 = *(undefined4 *)
               (CONCAT44(bucket_usage.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         (int)bucket_usage.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start) + uVar16 * 4);
      poVar11 = std::operator<<((ostream *)&std::cout,(string *)name);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      poVar11 = std::operator<<(poVar11,";");
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::operator<<(poVar11,";");
      auVar17._8_8_ = extraout_XMM0_Qb;
      auVar17._0_8_ = dVar18;
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar17 = vxorpd_avx512vl(auVar17,auVar6);
      auVar6 = vcvtusi2sd_avx512f(in_XMM3,uVar5);
      poVar11 = std::ostream::_M_insert<double>(auVar17._0_8_ - local_b8 / auVar6._0_8_);
      std::endl<char,std::char_traits<char>>(poVar11);
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&real_dists);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bucket_usage.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bucket_max.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bucket_min.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bucket_sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&bucket_map.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void compute_skew(std::vector<uint32_t>& input, std::string name)
{
    std::vector<uint32_t> bucket_map(1 << 27);
    for (size_t i = 0; i < bucket_map.size(); i++) {
        bucket_map[i] = compute_bucket<fidelity>(i);
    }
    std::vector<uint32_t> bucket_sizes;
    std::vector<uint32_t> bucket_min;
    std::vector<uint32_t> bucket_max;
    uint32_t prev = bucket_map[0];
    bucket_min.push_back(0);
    auto cur_size = 1;
    for (size_t i = 1; i < bucket_map.size(); i++) {
        auto cur = bucket_map[i];
        if (cur != prev) {
            bucket_max.push_back(i - 1);
            bucket_min.push_back(i);
            bucket_sizes.push_back(cur_size);
            cur_size = 0;
        }
        cur_size++;
        prev = cur;
    }
    if (cur_size) {
        bucket_max.push_back(bucket_map.size() - 1);
        bucket_sizes.push_back(cur_size);
    }

    std::vector<uint32_t> bucket_usage(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        bucket_usage[bucket_id]++;
    }

    std::vector<std::vector<double>> real_dists(bucket_sizes.size());
    for (size_t i = 0; i < input.size(); i++) {
        auto bucket_id = compute_bucket<fidelity>(input[i]);
        if (real_dists[bucket_id].size() == 0)
            real_dists[bucket_id].resize(bucket_sizes[bucket_id]);
        auto bucket_offset = input[i] - bucket_min[bucket_id];
        real_dists[bucket_id][bucket_offset] += 1.0;
    }
    size_t usage_cum_sum = 0;
    for (size_t i = 0; i < bucket_sizes.size(); i++) {
        if (bucket_usage[i] != 0) {
            double bits_uniform = -log2(double(1.0) / double(bucket_sizes[i]));
            double bits_real = 0.0;
            for (size_t j = 0; j < real_dists[i].size(); j++) {
                if (real_dists[i][j] != 0.0) {
                    double bits
                        = -log2(real_dists[i][j] / double(bucket_usage[i]));
                    bits_real += real_dists[i][j] * bits;
                }
            }
            bits_real /= double(bucket_usage[i]);
            usage_cum_sum += bucket_usage[i];
            std::cout << name << ";" << i << ";" << fidelity << ";"
                      << bucket_min[i] << ";" << bucket_max[i] << ";"
                      << bucket_sizes[i] << ";" << bucket_usage[i] << ";"
                      << usage_cum_sum << ";" << input.size() << ";"
                      << (bits_uniform - bits_real) << std::endl;
        }
    }
}